

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int wally_descriptor_to_address
              (char *descriptor,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t derive_child_num,uint32_t network,uint32_t flags,char **output)

{
  uint32_t *local_a0;
  undefined1 local_70 [8];
  wally_descriptor_script_item script_item;
  address_script_t *addr_item;
  size_t addr_tbl_max;
  size_t index;
  uint32_t local_38;
  int ret;
  uint32_t network_local;
  uint32_t derive_child_num_local;
  size_t array_len_local;
  char **key_value_array_local;
  char **key_name_array_local;
  char *descriptor_local;
  
  script_item.script_len = 0;
  if (output == (char **)0x0) {
    descriptor_local._4_4_ = -2;
  }
  else {
    if (network == 0xff) {
      script_item.script_len = 0x1ed6a0;
    }
    else {
      for (addr_tbl_max = 0; addr_tbl_max < 5; addr_tbl_max = addr_tbl_max + 1) {
        if (network == g_network_address_table[addr_tbl_max].network) {
          script_item.script_len = (size_t)(g_network_address_table + addr_tbl_max);
          break;
        }
      }
    }
    if (script_item.script_len == 0) {
      descriptor_local._4_4_ = -2;
    }
    else {
      local_38 = network;
      ret = derive_child_num;
      _network_local = array_len;
      array_len_local = (size_t)key_value_array;
      key_value_array_local = key_name_array;
      key_name_array_local = (char **)descriptor;
      wally_bzero(local_70,0x18);
      local_70._0_4_ = ret;
      if (script_item.script_len == 0) {
        local_a0 = (uint32_t *)0x0;
      }
      else {
        local_a0 = &local_38;
      }
      index._4_4_ = parse_miniscript((char *)key_name_array_local,key_value_array_local,
                                     (char **)array_len_local,_network_local,flags,3,local_a0,0,0,
                                     (wally_descriptor_script_item *)local_70,1,(uint32_t *)0x0,
                                     (char **)0x0);
      if (index._4_4_ == 0) {
        index._4_4_ = descriptor_scriptpubkey_to_address
                                ((address_script_t *)script_item.script_len,
                                 (uchar *)script_item._0_8_,(size_t)script_item.script,output);
      }
      if (script_item._0_8_ != 0) {
        wally_bzero((void *)script_item._0_8_,(size_t)script_item.script);
        wally_free((void *)script_item._0_8_);
      }
      descriptor_local._4_4_ = index._4_4_;
    }
  }
  return descriptor_local._4_4_;
}

Assistant:

int wally_descriptor_to_address(
    const char *descriptor,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t derive_child_num,
    uint32_t network,
    uint32_t flags,
    char **output)
{
    int ret;
    size_t index;
    size_t addr_tbl_max = sizeof(g_network_address_table) / sizeof(struct address_script_t);
    const struct address_script_t *addr_item = NULL;
    struct wally_descriptor_script_item script_item;

    if (!output)
        return WALLY_EINVAL;

    if (network == WALLY_NETWORK_BITCOIN_REGTEST)
        addr_item = &g_network_address_table[2];  /* bitcoin regtest */
    else
        for (index = 0; index < addr_tbl_max; ++index) {
            if (network == (uint32_t)g_network_address_table[index].network) {
                addr_item = &g_network_address_table[index];
                break;
            }
        }

    if (!addr_item)
        return WALLY_EINVAL;

    wally_bzero(&script_item, sizeof(script_item));
    script_item.child_num = derive_child_num;

    ret = parse_miniscript(
        descriptor,
        key_name_array,
        key_value_array,
        array_len,
        flags,
        DESCRIPTOR_KIND_MINISCRIPT | DESCRIPTOR_KIND_DESCRIPTOR,
        (!addr_item) ? NULL : &network,
        0,
        0,
        &script_item,
        1,
        NULL,
        NULL);
    if (ret == WALLY_OK)
        ret = descriptor_scriptpubkey_to_address(addr_item,
                                                 script_item.script,
                                                 script_item.script_len,
                                                 output);

    if (script_item.script) {
        wally_bzero((char *)script_item.script, script_item.script_len);
        wally_free(script_item.script);
    }
    return ret;
}